

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O1

vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *
tinyusdz::lerp<tinyusdz::value::normal3f>
          (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *a,
          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *b,double t)

{
  float fVar1;
  float fVar2;
  pointer pnVar3;
  pointer pnVar4;
  pointer pnVar5;
  ulong uVar6;
  long lVar7;
  ulong __new_size;
  float fVar8;
  float fVar9;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = ((long)(a->
                 super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a->
                 super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  __new_size = ((long)(b->
                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(b->
                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  if (uVar6 <= __new_size) {
    __new_size = uVar6;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      fVar8 = (float)(1.0 - t);
      fVar9 = (float)t;
      lVar7 = 8;
      do {
        pnVar3 = (a->
                 super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pnVar4 = (b->
                 super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        fVar1 = *(float *)((long)&pnVar3->x + lVar7);
        fVar2 = *(float *)((long)&pnVar4->x + lVar7);
        pnVar5 = (__return_storage_ptr__->
                 super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)pnVar5 + lVar7 + -8) =
             CONCAT44(*(float *)((long)pnVar4 + lVar7 + -4) * fVar9 +
                      *(float *)((long)pnVar3 + lVar7 + -4) * fVar8,
                      *(float *)((long)pnVar4 + lVar7 + -8) * fVar9 +
                      *(float *)((long)pnVar3 + lVar7 + -8) * fVar8);
        *(float *)((long)&pnVar5->x + lVar7) = fVar2 * fVar9 + fVar1 * fVar8;
        lVar7 = lVar7 + 0xc;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}